

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

string * __thiscall
Search::search::pretty_label_abi_cxx11_(string *__return_storage_ptr__,search *this,action a)

{
  namedlabels *pnVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostringstream os;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  pnVar1 = this->priv->all->sd->ldict;
  if (pnVar1 == (namedlabels *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    if (a - 1 < pnVar1->K) {
      lVar2 = *(long *)&(pnVar1->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                        _M_impl.super__Vector_impl_data;
      lVar3 = (ulong)(a - 1) * 0x10;
      uVar5 = *(undefined8 *)(lVar2 + lVar3);
      uVar4 = *(undefined8 *)(lVar2 + 8 + lVar3);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,uVar5,uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

string search::pretty_label(action a)
{
  if (this->priv->all->sd->ldict)
  {
    substring ss = this->priv->all->sd->ldict->get(a);
    return string(ss.begin, ss.end - ss.begin);
  }
  else
  {
    ostringstream os;
    os << a;
    return os.str();
  }
}